

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::
GenerateSerializationCode(RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  RepeatedImmutablePrimitiveFieldGenerator *this_local;
  
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (get$capitalized_name$List().size() > 0) {\n  output.writeUInt32NoTag($tag$);\n  output.writeUInt32NoTag($name$MemoizedSerializedSize);\n}\nfor (int i = 0; i < $name$_.size(); i++) {\n  output.write$capitalized_type$NoTag($repeated_get$(i));\n}\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "for (int i = 0; i < $name$_.size(); i++) {\n  output.write$capitalized_type$($number$, $repeated_get$(i));\n}\n"
                      );
  }
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::GenerateSerializationCode(
    io::Printer* printer) const {
  if (descriptor_->is_packed()) {
    // We invoke getSerializedSize in writeTo for messages that have packed
    // fields in ImmutableMessageGenerator::GenerateMessageSerializationMethods.
    // That makes it safe to rely on the memoized size here.
    printer->Print(variables_,
                   "if (get$capitalized_name$List().size() > 0) {\n"
                   "  output.writeUInt32NoTag($tag$);\n"
                   "  output.writeUInt32NoTag($name$MemoizedSerializedSize);\n"
                   "}\n"
                   "for (int i = 0; i < $name$_.size(); i++) {\n"
                   "  output.write$capitalized_type$NoTag($repeated_get$(i));\n"
                   "}\n");
  } else {
    printer->Print(
        variables_,
        "for (int i = 0; i < $name$_.size(); i++) {\n"
        "  output.write$capitalized_type$($number$, $repeated_get$(i));\n"
        "}\n");
  }
}